

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rd.c
# Opt level: O0

void av1_update_rd_thresh_fact
               (AV1_COMMON *cm,int (*factor_buf) [169],int use_adaptive_rd_thresh,BLOCK_SIZE bsize,
               THR_MODES best_mode_index,THR_MODES inter_mode_start,THR_MODES inter_mode_end,
               THR_MODES intra_mode_start,THR_MODES intra_mode_end)

{
  BLOCK_SIZE in_CL;
  int in_EDX;
  int (*in_RSI) [169];
  long in_RDI;
  THR_MODES in_R8B;
  THR_MODES in_R9B;
  THR_MODES in_stack_00000008;
  THR_MODES in_stack_00000010;
  THR_MODES in_stack_00000018;
  BLOCK_SIZE max_size;
  BLOCK_SIZE min_size;
  int bsize_is_1_to_4;
  int max_rd_thresh_factor;
  undefined1 local_22;
  undefined1 local_21;
  
  local_22 = in_CL;
  local_21 = in_CL;
  if (in_CL <= *(BLOCK_SIZE *)(*(long *)(in_RDI + 0x6088) + 0x1c)) {
    if ((int)(in_CL - 2) < 1) {
      local_21 = BLOCK_4X4;
    }
    else {
      local_21 = in_CL - BLOCK_8X4;
    }
    if (in_CL + 2 < (uint)*(byte *)(*(long *)(in_RDI + 0x6088) + 0x1c)) {
      local_22 = in_CL + BLOCK_8X4;
    }
    else {
      local_22 = *(BLOCK_SIZE *)(*(long *)(in_RDI + 0x6088) + 0x1c);
    }
  }
  update_thr_fact(in_RSI,in_R8B,in_R9B,in_stack_00000008,local_21,local_22,in_EDX << 6);
  update_thr_fact(in_RSI,in_R8B,in_stack_00000010,in_stack_00000018,local_21,local_22,in_EDX << 6);
  return;
}

Assistant:

void av1_update_rd_thresh_fact(
    const AV1_COMMON *const cm, int (*factor_buf)[MAX_MODES],
    int use_adaptive_rd_thresh, BLOCK_SIZE bsize, THR_MODES best_mode_index,
    THR_MODES inter_mode_start, THR_MODES inter_mode_end,
    THR_MODES intra_mode_start, THR_MODES intra_mode_end) {
  assert(use_adaptive_rd_thresh > 0);
  const int max_rd_thresh_factor = use_adaptive_rd_thresh * RD_THRESH_MAX_FACT;

  const int bsize_is_1_to_4 = bsize > cm->seq_params->sb_size;
  BLOCK_SIZE min_size, max_size;
  if (bsize_is_1_to_4) {
    // This part handles block sizes with 1:4 and 4:1 aspect ratios
    // TODO(any): Experiment with threshold update for parent/child blocks
    min_size = bsize;
    max_size = bsize;
  } else {
    min_size = AOMMAX(bsize - 2, BLOCK_4X4);
    max_size = AOMMIN(bsize + 2, (int)cm->seq_params->sb_size);
  }

  update_thr_fact(factor_buf, best_mode_index, inter_mode_start, inter_mode_end,
                  min_size, max_size, max_rd_thresh_factor);
  update_thr_fact(factor_buf, best_mode_index, intra_mode_start, intra_mode_end,
                  min_size, max_size, max_rd_thresh_factor);
}